

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O2

void amrex::average_cellcenter_to_face
               (Array<MultiFab_*,_3> *fc,MultiFab *cc,Geometry *geom,int ncomp,
               bool use_harmonic_averaging)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  Array<MultiFab_*,_3> *pAVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int i;
  undefined7 in_register_00000081;
  ulong uVar10;
  int k;
  int k_00;
  int j;
  int j_00;
  long lVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  Array4<const_double> local_220;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  undefined4 local_1cc;
  int local_1c8;
  Box local_1c4;
  Box local_1a8;
  Box local_18c;
  Array<MultiFab_*,_3> *local_170;
  FabArray<amrex::FArrayBox> *local_168;
  ulong local_160;
  ulong local_158;
  Array4<double> local_150;
  Array4<double> local_110;
  Array4<double> local_d0;
  MFIter mfi;
  
  local_1cc = (undefined4)CONCAT71(in_register_00000081,use_harmonic_averaging);
  local_170 = fc;
  local_168 = &cc->super_FabArray<amrex::FArrayBox>;
  MFIter::MFIter(&mfi,(FabArrayBase *)cc,true);
  if (ncomp < 1) {
    ncomp = 0;
  }
  local_160 = (ulong)(uint)ncomp;
  do {
    if (mfi.endIndex <= mfi.currentIndex) {
      MFIter::~MFIter(&mfi);
      return;
    }
    MFIter::nodaltilebox(&local_18c,&mfi,0);
    MFIter::nodaltilebox(&local_1a8,&mfi,1);
    MFIter::nodaltilebox(&local_1c4,&mfi,2);
    pAVar5 = local_170;
    local_1d4 = local_1a8.smallend.vect[0];
    if (local_18c.smallend.vect[0] < local_1a8.smallend.vect[0]) {
      local_1d4 = local_18c.smallend.vect[0];
    }
    local_1d8 = local_1a8.smallend.vect[1];
    if (local_18c.smallend.vect[1] < local_1a8.smallend.vect[1]) {
      local_1d8 = local_18c.smallend.vect[1];
    }
    local_1e0 = local_1a8.smallend.vect[2];
    if (local_18c.smallend.vect[2] < local_1a8.smallend.vect[2]) {
      local_1e0 = local_18c.smallend.vect[2];
    }
    uVar4 = local_1a8.bigend.vect[0];
    if (local_1a8.bigend.vect[0] < local_18c.bigend.vect[0]) {
      uVar4 = local_18c.bigend.vect[0];
    }
    local_1d0 = local_1a8.bigend.vect[1];
    if (local_1a8.bigend.vect[1] < local_18c.bigend.vect[1]) {
      local_1d0 = local_18c.bigend.vect[1];
    }
    local_1dc = local_1a8.bigend.vect[2];
    if (local_1a8.bigend.vect[2] < local_18c.bigend.vect[2]) {
      local_1dc = local_18c.bigend.vect[2];
    }
    if (local_1c4.smallend.vect[0] <= local_1d4) {
      local_1d4 = local_1c4.smallend.vect[0];
    }
    if (local_1c4.smallend.vect[1] <= local_1d8) {
      local_1d8 = local_1c4.smallend.vect[1];
    }
    if (local_1c4.smallend.vect[2] <= local_1e0) {
      local_1e0 = local_1c4.smallend.vect[2];
    }
    if ((int)uVar4 <= local_1c4.bigend.vect[0]) {
      uVar4 = local_1c4.bigend.vect[0];
    }
    if (local_1d0 <= local_1c4.bigend.vect[1]) {
      local_1d0 = local_1c4.bigend.vect[1];
    }
    if (local_1dc <= local_1c4.bigend.vect[2]) {
      local_1dc = local_1c4.bigend.vect[2];
    }
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_110,&local_170->_M_elems[0]->super_FabArray<amrex::FArrayBox>,&mfi);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_150,&pAVar5->_M_elems[1]->super_FabArray<amrex::FArrayBox>,&mfi);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_d0,&pAVar5->_M_elems[2]->super_FabArray<amrex::FArrayBox>,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_220,local_168,&mfi);
    local_1c8 = uVar4 + 1;
    local_158 = (ulong)uVar4;
    for (uVar10 = 0; k_00 = local_1e0, uVar10 != local_160; uVar10 = uVar10 + 1) {
      for (; j_00 = local_1d8, k_00 <= local_1dc; k_00 = k_00 + 1) {
        for (; j_00 <= local_1d0; j_00 = j_00 + 1) {
          i = local_1d4;
          if (local_1d4 <= (int)local_158) {
            do {
              bVar6 = Box::contains(&local_18c,i,j_00,k_00);
              lVar9 = (long)j_00;
              lVar11 = (long)k_00;
              if ((char)local_1cc == '\0') {
                if (bVar6) {
                  lVar7 = (lVar9 - local_220.begin.y) * local_220.jstride;
                  lVar8 = (lVar11 - local_220.begin.z) * local_220.kstride;
                  local_110.p
                  [(lVar9 - local_110.begin.y) * local_110.jstride +
                   (long)(i - local_110.begin.x) +
                   (lVar11 - local_110.begin.z) * local_110.kstride + local_110.nstride * uVar10] =
                       (local_220.p
                        [lVar7 + (long)((i - local_220.begin.x) + -1) +
                                 lVar8 + local_220.nstride * uVar10] +
                       local_220.p
                       [lVar7 + (long)(i - local_220.begin.x) + lVar8 + local_220.nstride * uVar10])
                       * 0.5;
                }
                bVar6 = Box::contains(&local_1a8,i,j_00,k_00);
                if (bVar6) {
                  lVar7 = (lVar11 - local_220.begin.z) * local_220.kstride;
                  local_150.p
                  [(lVar9 - local_150.begin.y) * local_150.jstride +
                   (long)(i - local_150.begin.x) +
                   (lVar11 - local_150.begin.z) * local_150.kstride + local_150.nstride * uVar10] =
                       (local_220.p
                        [(~local_220.begin.y + j_00) * local_220.jstride +
                         (long)(i - local_220.begin.x) + lVar7 + local_220.nstride * uVar10] +
                       local_220.p
                       [(j_00 - local_220.begin.y) * local_220.jstride +
                        (long)(i - local_220.begin.x) + lVar7 + local_220.nstride * uVar10]) * 0.5;
                }
                bVar6 = Box::contains(&local_1c4,i,j_00,k_00);
                if (bVar6) {
                  lVar7 = (lVar9 - local_220.begin.y) * local_220.jstride;
                  dVar13 = (local_220.p
                            [lVar7 + (long)(i - local_220.begin.x) +
                                     (~local_220.begin.z + k_00) * local_220.kstride +
                                     local_220.nstride * uVar10] +
                           local_220.p
                           [lVar7 + (long)(i - local_220.begin.x) +
                                    (k_00 - local_220.begin.z) * local_220.kstride +
                                    local_220.nstride * uVar10]) * 0.5;
                  goto LAB_00443531;
                }
              }
              else {
                if (bVar6) {
                  lVar7 = (lVar9 - local_220.begin.y) * local_220.jstride;
                  lVar8 = (lVar11 - local_220.begin.z) * local_220.kstride;
                  dVar13 = local_220.p
                           [lVar7 + (long)(~local_220.begin.x + i) +
                                    lVar8 + local_220.nstride * uVar10];
                  dVar12 = 0.0;
                  if ((dVar13 != 0.0) || (NAN(dVar13))) {
                    dVar1 = local_220.p
                            [lVar7 + (long)(i - local_220.begin.x) +
                                     lVar8 + local_220.nstride * uVar10];
                    if ((dVar1 != 0.0) || (NAN(dVar1))) {
                      auVar14._8_8_ = dVar1;
                      auVar14._0_8_ = dVar13;
                      auVar14 = divpd(_DAT_00601290,auVar14);
                      dVar12 = 2.0 / (auVar14._8_8_ + auVar14._0_8_);
                    }
                  }
                  local_110.p
                  [(lVar9 - local_110.begin.y) * local_110.jstride +
                   (long)(i - local_110.begin.x) +
                   (lVar11 - local_110.begin.z) * local_110.kstride + local_110.nstride * uVar10] =
                       dVar12;
                }
                bVar6 = Box::contains(&local_1a8,i,j_00,k_00);
                if (bVar6) {
                  lVar7 = (lVar11 - local_220.begin.z) * local_220.kstride;
                  dVar13 = local_220.p
                           [(~local_220.begin.y + j_00) * local_220.jstride +
                            (long)(i - local_220.begin.x) + lVar7 + local_220.nstride * uVar10];
                  dVar12 = 0.0;
                  if ((dVar13 != 0.0) || (NAN(dVar13))) {
                    dVar1 = local_220.p
                            [local_220.jstride * (j_00 - local_220.begin.y) +
                             (long)(i - local_220.begin.x) + lVar7 + local_220.nstride * uVar10];
                    if ((dVar1 != 0.0) || (NAN(dVar1))) {
                      auVar2._8_8_ = dVar1;
                      auVar2._0_8_ = dVar13;
                      auVar14 = divpd(_DAT_00601290,auVar2);
                      dVar12 = 2.0 / (auVar14._8_8_ + auVar14._0_8_);
                    }
                  }
                  local_150.p
                  [(lVar9 - local_150.begin.y) * local_150.jstride +
                   (long)(i - local_150.begin.x) +
                   (lVar11 - local_150.begin.z) * local_150.kstride + local_150.nstride * uVar10] =
                       dVar12;
                }
                bVar6 = Box::contains(&local_1c4,i,j_00,k_00);
                if (bVar6) {
                  lVar7 = (lVar9 - local_220.begin.y) * local_220.jstride;
                  dVar12 = local_220.p
                           [lVar7 + (long)(i - local_220.begin.x) +
                                    (~local_220.begin.z + k_00) * local_220.kstride +
                                    local_220.nstride * uVar10];
                  dVar13 = 0.0;
                  if ((dVar12 != 0.0) || (NAN(dVar12))) {
                    dVar1 = local_220.p
                            [lVar7 + (long)(i - local_220.begin.x) +
                                     local_220.kstride * (k_00 - local_220.begin.z) +
                                     local_220.nstride * uVar10];
                    if ((dVar1 != 0.0) || (NAN(dVar1))) {
                      auVar3._8_8_ = dVar1;
                      auVar3._0_8_ = dVar12;
                      auVar14 = divpd(_DAT_00601290,auVar3);
                      dVar13 = 2.0 / (auVar14._8_8_ + auVar14._0_8_);
                    }
                  }
LAB_00443531:
                  local_d0.p
                  [(lVar9 - local_d0.begin.y) * local_d0.jstride +
                   (long)(i - local_d0.begin.x) +
                   (lVar11 - local_d0.begin.z) * local_d0.kstride + local_d0.nstride * uVar10] =
                       dVar13;
                }
              }
              i = i + 1;
            } while (local_1c8 != i);
          }
        }
      }
    }
    MFIter::operator++(&mfi);
  } while( true );
}

Assistant:

void average_cellcenter_to_face (const Array<MultiFab*,AMREX_SPACEDIM>& fc, const MultiFab& cc,
                                    const Geometry& geom, int ncomp, bool use_harmonic_averaging)
    {
        AMREX_ASSERT(cc.nComp() == ncomp);
        AMREX_ASSERT(cc.nGrow() >= 1);
        AMREX_ASSERT(fc[0]->nComp() == ncomp); // We only expect fc to have the gradient perpendicular to the face
#if (AMREX_SPACEDIM >= 2)
        AMREX_ASSERT(fc[1]->nComp() == ncomp); // We only expect fc to have the gradient perpendicular to the face
#endif
#if (AMREX_SPACEDIM == 3)
        AMREX_ASSERT(fc[2]->nComp() == ncomp); // We only expect fc to have the gradient perpendicular to the face
#endif


#if (AMREX_SPACEDIM == 1)
        const GeometryData& gd = geom.data();
        if (use_harmonic_averaging) {
            AMREX_ASSERT(gd.Coord() == 0);
        }
#else
        amrex::ignore_unused(geom);
#endif

#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion() && cc.isFusingCandidate()) {
            auto const& ccma = cc.const_arrays();
            AMREX_D_TERM(auto const& fxma = fc[0]->arrays();,
                         auto const& fyma = fc[1]->arrays();,
                         auto const& fzma = fc[2]->arrays(););
            MultiFab foo(amrex::convert(cc.boxArray(),IntVect(1)), cc.DistributionMap(), 1, 0,
                         MFInfo().SetAlloc(false));
            IntVect ng = -cc.nGrowVect();
            ParallelFor(foo, IntVect(0), ncomp,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
            {
                Box ccbx(ccma[box_no]);
                ccbx.grow(ng);
                AMREX_D_TERM(Box const& xbx = amrex::surroundingNodes(ccbx,0);,
                             Box const& ybx = amrex::surroundingNodes(ccbx,1);,
                             Box const& zbx = amrex::surroundingNodes(ccbx,2););
#if (AMREX_SPACEDIM == 1)
                amrex_avg_cc_to_fc(i,j,k,n, xbx, fxma[box_no], ccma[box_no], gd, use_harmonic_averaging);
#else
                amrex_avg_cc_to_fc(i,j,k,n, AMREX_D_DECL(xbx,ybx,zbx),
                                   AMREX_D_DECL(fxma[box_no],fyma[box_no],fzma[box_no]),
                                   ccma[box_no], use_harmonic_averaging);
#endif
            });
            Gpu::streamSynchronize();
        } else
#endif
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(cc,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                AMREX_D_TERM(const Box& xbx = mfi.nodaltilebox(0);,
                             const Box& ybx = mfi.nodaltilebox(1);,
                             const Box& zbx = mfi.nodaltilebox(2););
                const auto& index_bounds = amrex::getIndexBounds(AMREX_D_DECL(xbx,ybx,zbx));

                AMREX_D_TERM(Array4<Real> const& fxarr = fc[0]->array(mfi);,
                             Array4<Real> const& fyarr = fc[1]->array(mfi);,
                             Array4<Real> const& fzarr = fc[2]->array(mfi););
                Array4<Real const> const& ccarr = cc.const_array(mfi);

#if (AMREX_SPACEDIM == 1)
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D(index_bounds, ncomp, i, j, k, n,
                {
                    amrex_avg_cc_to_fc(i,j,k,n, xbx, fxarr, ccarr, gd, use_harmonic_averaging);
                });
#else
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D(index_bounds, ncomp, i, j, k, n,
                {
                    amrex_avg_cc_to_fc(i,j,k,n, AMREX_D_DECL(xbx,ybx,zbx),
                                       AMREX_D_DECL(fxarr,fyarr,fzarr), ccarr,
                                       use_harmonic_averaging);
                });
#endif
            }
        }
    }